

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlIsNameStartChar(xmlParserCtxtPtr ctxt,int c)

{
  int iVar1;
  int c_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->options & 0x20000U) == 0) {
    if ((((c != 0x20) && (c != 0x3e)) && (c != 0x2f)) &&
       ((((0x60 < c && (c < 0x7b)) ||
         (((0x40 < c && (c < 0x5b)) || (((c == 0x5f || (c == 0x3a)) || ((0xbf < c && (c < 0xd7))))))
         )) || ((((((0xd7 < c && (c < 0xf7)) || ((0xf7 < c && (c < 0x300)))) ||
                  ((0x36f < c && (c < 0x37e)))) || ((0x37e < c && (c < 0x2000)))) ||
                ((((((0x200b < c && (c < 0x200e)) || ((0x206f < c && (c < 0x2190)))) ||
                   ((0x2bff < c && (c < 0x2ff0)))) ||
                  (((0x3000 < c && (c < 0xd800)) ||
                   (((0xf8ff < c && (c < 0xfdd0)) || ((0xfdef < c && (c < 0xfffe)))))))) ||
                 ((0xffff < c && (c < 0xf0000)))))))))) {
      return 1;
    }
LAB_00189e70:
    ctxt_local._4_4_ = 0;
  }
  else {
    if (c < 0x100) {
      if (((((c < 0x41) || (0x5a < c)) && ((c < 0x61 || (0x7a < c)))) &&
          (((c < 0xc0 || (0xd6 < c)) && ((c < 0xd8 || (0xf6 < c)))))) && (c < 0xf8)) {
LAB_00189e19:
        if ((((c < 0x100) ||
             ((((c < 0x4e00 || (0x9fa5 < c)) && (c != 0x3007)) && ((c < 0x3021 || (0x3029 < c))))))
            && (c != 0x5f)) && (c != 0x3a)) goto LAB_00189e70;
      }
    }
    else {
      iVar1 = xmlCharInRange(c,&xmlIsBaseCharGroup);
      if (iVar1 == 0) goto LAB_00189e19;
    }
    ctxt_local._4_4_ = 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlIsNameStartChar(xmlParserCtxtPtr ctxt, int c) {
    if ((ctxt->options & XML_PARSE_OLD10) == 0) {
        /*
	 * Use the new checks of production [4] [4a] amd [5] of the
	 * Update 5 of XML-1.0
	 */
	if ((c != ' ') && (c != '>') && (c != '/') && /* accelerators */
	    (((c >= 'a') && (c <= 'z')) ||
	     ((c >= 'A') && (c <= 'Z')) ||
	     (c == '_') || (c == ':') ||
	     ((c >= 0xC0) && (c <= 0xD6)) ||
	     ((c >= 0xD8) && (c <= 0xF6)) ||
	     ((c >= 0xF8) && (c <= 0x2FF)) ||
	     ((c >= 0x370) && (c <= 0x37D)) ||
	     ((c >= 0x37F) && (c <= 0x1FFF)) ||
	     ((c >= 0x200C) && (c <= 0x200D)) ||
	     ((c >= 0x2070) && (c <= 0x218F)) ||
	     ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	     ((c >= 0x3001) && (c <= 0xD7FF)) ||
	     ((c >= 0xF900) && (c <= 0xFDCF)) ||
	     ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	     ((c >= 0x10000) && (c <= 0xEFFFF))))
	    return(1);
    } else {
        if (IS_LETTER(c) || (c == '_') || (c == ':'))
	    return(1);
    }
    return(0);
}